

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeAsyncGeneratorFunctionConstructor
               (DynamicObject *asyncGeneratorFunctionConstructor,
               DeferredTypeHandlerBase *typeHandler,DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StaticType *type;
  LiteralString *pLVar5;
  
  DeferredTypeHandlerBase::Convert(typeHandler,asyncGeneratorFunctionConstructor,mode,3,0);
  pJVar1 = (((asyncGeneratorFunctionConstructor->super_RecyclableObject).type.ptr)->
           javascriptLibrary).ptr;
  if (((((pJVar1->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES2018AsyncIteration == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0xb68,
                                "(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled())"
                                ,
                                "library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  (*(asyncGeneratorFunctionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncGeneratorFunctionConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  (*(asyncGeneratorFunctionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncGeneratorFunctionConstructor,0x124,
             (pJVar1->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype.ptr,0,0,0,0);
  type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
  pLVar5 = LiteralString::New(type,L"AsyncGeneratorFunction",0x16,pJVar1->recycler);
  (*(asyncGeneratorFunctionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncGeneratorFunctionConstructor,0x106,pLVar5,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(asyncGeneratorFunctionConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncGeneratorFunctionConstructor(DynamicObject* asyncGeneratorFunctionConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(asyncGeneratorFunctionConstructor, mode, 3);
        JavascriptLibrary* library = asyncGeneratorFunctionConstructor->GetLibrary();
        Assert(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled());

        library->AddMember(asyncGeneratorFunctionConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(asyncGeneratorFunctionConstructor, PropertyIds::prototype, library->asyncGeneratorFunctionPrototype, PropertyNone);
        library->AddMember(asyncGeneratorFunctionConstructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("AsyncGeneratorFunction")), PropertyConfigurable);

        asyncGeneratorFunctionConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }